

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

EdgeBool * __thiscall
indigox::utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
GetEdge(Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *this,
       VertType u,VertType v)

{
  __shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDX;
  EdgeBool *in_RDI;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>::config>_>
  *in_stack_00000050;
  vertex_descriptor in_stack_00000058;
  vertex_descriptor in_stack_00000060;
  
  std::
  __shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*(in_RDX);
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>::config>>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050);
  return in_RDI;
}

Assistant:

EdgeBool GetEdge(VertType u, VertType v) const
      {
        return boost::edge(u, v, *graph_);
      }